

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool Fossilize::json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               (VkRenderPassCreateInfo *pass,MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc,
               Value *out_value)

{
  uint uVar1;
  VkSubpassDependency *pVVar2;
  VkAttachmentDescription *pVVar3;
  VkSubpassDescription *pVVar4;
  VkAttachmentReference *pVVar5;
  bool bVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  Data local_1c8;
  Value preserves;
  Value dep;
  Value inputs;
  Value input;
  Data local_158;
  Value attachments;
  Value subpasses;
  Value deps;
  StringRefType local_100;
  StringRefType local_f0;
  StringRefType local_e0;
  StringRefType local_d0;
  StringRefType local_c0;
  StringRefType local_b0;
  StringRefType local_a0;
  StringRefType local_90;
  StringRefType local_80;
  StringRefType local_70;
  StringRefType local_60;
  StringRefType local_50;
  StringRefType local_40;
  
  local_158.n.i64 = (Number)0x0;
  local_158.s.str = (Ch *)0x3000000000000;
  local_1c8._4_1_ = '\0';
  local_1c8._5_1_ = '\0';
  local_1c8._6_1_ = '\0';
  local_1c8._7_1_ = '\0';
  local_1c8._0_4_ = pass->flags;
  preserves.data_.s.str = (Ch *)0x40500000014ebff;
  preserves.data_.n = (Number)0x5;
  local_1c8.s.str = (Ch *)((ulong)(-1 < (int)pass->flags) << 0x35 | 0x1d6000000000000);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_158.s,&preserves,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_1c8.s,alloc);
  deps.data_.n = (Number)0x0;
  deps.data_.s.str = (Ch *)0x4000000000000;
  subpasses.data_.n = (Number)0x0;
  subpasses.data_.s.str = (Ch *)0x4000000000000;
  attachments.data_.n = (Number)0x0;
  attachments.data_.s.str = (Ch *)0x4000000000000;
  if (pass->pDependencies != (VkSubpassDependency *)0x0) {
    if (pass->dependencyCount != 0) {
      lVar9 = 0x18;
      uVar7 = 0;
      do {
        pVVar2 = pass->pDependencies;
        dep.data_.n = (Number)0x0;
        dep.data_.s.str = (Ch *)0x3000000000000;
        uVar1 = *(uint *)((long)&pVVar2->srcSubpass + lVar9);
        local_1c8._4_1_ = '\0';
        local_1c8._5_1_ = '\0';
        local_1c8._6_1_ = '\0';
        local_1c8._7_1_ = '\0';
        local_1c8._0_4_ = uVar1;
        preserves.data_.s.str = (Ch *)0x4050000001510b0;
        preserves.data_.n = (Number)0xf;
        local_1c8.s.str = (Ch *)((ulong)(-1 < (int)uVar1) << 0x35 | 0x1d6000000000000);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&dep,&preserves,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_1c8.s,alloc);
        uVar1 = *(uint *)((long)pVVar2 + lVar9 + -4);
        local_1c8._4_1_ = '\0';
        local_1c8._5_1_ = '\0';
        local_1c8._6_1_ = '\0';
        local_1c8._7_1_ = '\0';
        local_1c8._0_4_ = uVar1;
        preserves.data_.s.str = (Ch *)0x40500000014f761;
        preserves.data_.n = (Number)0xd;
        local_1c8.s.str = (Ch *)((ulong)(-1 < (int)uVar1) << 0x35 | 0x1d6000000000000);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&dep,&preserves,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_1c8.s,alloc);
        uVar1 = *(uint *)((long)pVVar2 + lVar9 + -8);
        local_1c8._4_1_ = '\0';
        local_1c8._5_1_ = '\0';
        local_1c8._6_1_ = '\0';
        local_1c8._7_1_ = '\0';
        local_1c8._0_4_ = uVar1;
        preserves.data_.s.str = (Ch *)0x40500000014f746;
        preserves.data_.n = (Number)0xd;
        local_1c8.s.str = (Ch *)((ulong)(-1 < (int)uVar1) << 0x35 | 0x1d6000000000000);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&dep,&preserves,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_1c8.s,alloc);
        uVar1 = *(uint *)((long)pVVar2 + lVar9 + -0xc);
        local_1c8._4_1_ = '\0';
        local_1c8._5_1_ = '\0';
        local_1c8._6_1_ = '\0';
        local_1c8._7_1_ = '\0';
        local_1c8._0_4_ = uVar1;
        preserves.data_.s.str = (Ch *)0x40500000014f754;
        preserves.data_.n = (Number)0xc;
        local_1c8.s.str = (Ch *)((ulong)(-1 < (int)uVar1) << 0x35 | 0x1d6000000000000);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&dep,&preserves,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_1c8.s,alloc);
        uVar1 = *(uint *)((long)pVVar2 + lVar9 + -0x10);
        local_1c8._4_1_ = '\0';
        local_1c8._5_1_ = '\0';
        local_1c8._6_1_ = '\0';
        local_1c8._7_1_ = '\0';
        local_1c8._0_4_ = uVar1;
        preserves.data_.s.str = (Ch *)0x40500000014f739;
        preserves.data_.n = (Number)0xc;
        local_1c8.s.str = (Ch *)((ulong)(-1 < (int)uVar1) << 0x35 | 0x1d6000000000000);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&dep,&preserves,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_1c8.s,alloc);
        uVar1 = *(uint *)((long)pVVar2 + lVar9 + -0x14);
        local_1c8._4_1_ = '\0';
        local_1c8._5_1_ = '\0';
        local_1c8._6_1_ = '\0';
        local_1c8._7_1_ = '\0';
        local_1c8._0_4_ = uVar1;
        preserves.data_.s.str = (Ch *)0x4050000001510cb;
        preserves.data_.n = (Number)0xa;
        local_1c8.s.str = (Ch *)((ulong)(-1 < (int)uVar1) << 0x35 | 0x1d6000000000000);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&dep,&preserves,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_1c8.s,alloc);
        uVar1 = *(uint *)((long)pVVar2 + lVar9 + -0x18);
        local_1c8._4_1_ = '\0';
        local_1c8._5_1_ = '\0';
        local_1c8._6_1_ = '\0';
        local_1c8._7_1_ = '\0';
        local_1c8._0_4_ = uVar1;
        preserves.data_.s.str = (Ch *)0x4050000001510c0;
        preserves.data_.n = (Number)0xa;
        local_1c8.s.str = (Ch *)((ulong)(-1 < (int)uVar1) << 0x35 | 0x1d6000000000000);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&dep,&preserves,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_1c8.s,alloc);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::PushBack(&deps,&dep,alloc);
        uVar7 = uVar7 + 1;
        lVar9 = lVar9 + 0x1c;
      } while (uVar7 < pass->dependencyCount);
    }
    local_1c8.s.str = (Ch *)0x40500000014ee95;
    local_1c8.n = (Number)0xc;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_158.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_1c8.s,&deps,alloc);
  }
  if (pass->pAttachments != (VkAttachmentDescription *)0x0) {
    if (pass->attachmentCount != 0) {
      lVar9 = 0x20;
      uVar7 = 0;
      do {
        pVVar3 = pass->pAttachments;
        dep.data_.n = (Number)0x0;
        dep.data_.s.str = (Ch *)0x3000000000000;
        uVar1 = *(uint *)((long)pVVar3 + lVar9 + -0x20);
        local_1c8._4_1_ = '\0';
        local_1c8._5_1_ = '\0';
        local_1c8._6_1_ = '\0';
        local_1c8._7_1_ = '\0';
        local_1c8._0_4_ = uVar1;
        preserves.data_.s.str = (Ch *)0x40500000014ebff;
        preserves.data_.n = (Number)0x5;
        local_1c8.s.str = (Ch *)((ulong)(-1 < (int)uVar1) << 0x35 | 0x1d6000000000000);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&dep,&preserves,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_1c8.s,alloc);
        local_40.s = "format";
        local_40.length = 6;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkFormat>(&dep,&local_40,*(VkFormat *)((long)pVVar3 + lVar9 + -0x1c),alloc);
        local_50.s = "finalLayout";
        local_50.length = 0xb;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkImageLayout>
                  (&dep,&local_50,*(VkImageLayout *)((long)&pVVar3->flags + lVar9),alloc);
        local_60.s = "initialLayout";
        local_60.length = 0xd;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkImageLayout>
                  (&dep,&local_60,*(VkImageLayout *)((long)pVVar3 + lVar9 + -4),alloc);
        local_70.s = "loadOp";
        local_70.length = 6;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkAttachmentLoadOp>
                  (&dep,&local_70,*(VkAttachmentLoadOp *)((long)pVVar3 + lVar9 + -0x14),alloc);
        local_80.s = "storeOp";
        local_80.length = 7;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkAttachmentStoreOp>
                  (&dep,&local_80,*(VkAttachmentStoreOp *)((long)pVVar3 + lVar9 + -0x10),alloc);
        local_90.s = "samples";
        local_90.length = 7;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkSampleCountFlagBits>
                  (&dep,&local_90,*(VkSampleCountFlagBits *)((long)pVVar3 + lVar9 + -0x18),alloc);
        local_a0.s = "stencilLoadOp";
        local_a0.length = 0xd;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkAttachmentLoadOp>
                  (&dep,&local_a0,*(VkAttachmentLoadOp *)((long)pVVar3 + lVar9 + -0xc),alloc);
        local_b0.s = "stencilStoreOp";
        local_b0.length = 0xe;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkAttachmentStoreOp>
                  (&dep,&local_b0,*(VkAttachmentStoreOp *)((long)pVVar3 + lVar9 + -8),alloc);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::PushBack(&attachments,&dep,alloc);
        uVar7 = uVar7 + 1;
        lVar9 = lVar9 + 0x24;
      } while (uVar7 < pass->attachmentCount);
    }
    local_1c8.s.str = (Ch *)0x40500000014ee89;
    local_1c8.n = (Number)0xb;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_158.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_1c8.s,&attachments,alloc);
  }
  if (pass->subpassCount != 0) {
    uVar7 = 0;
    do {
      pVVar4 = pass->pSubpasses;
      dep.data_.n = (Number)0x0;
      dep.data_.s.str = (Ch *)0x3000000000000;
      local_1c8._4_1_ = '\0';
      local_1c8._5_1_ = '\0';
      local_1c8._6_1_ = '\0';
      local_1c8._7_1_ = '\0';
      local_1c8._0_4_ = pVVar4[uVar7].flags;
      preserves.data_.s.str = (Ch *)0x40500000014ebff;
      preserves.data_.n = (Number)0x5;
      local_1c8.s.str = (Ch *)((ulong)(-1 < (int)pVVar4[uVar7].flags) << 0x35 | 0x1d6000000000000);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&dep,&preserves,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_1c8.s,alloc);
      local_c0.s = "pipelineBindPoint";
      local_c0.length = 0x11;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<VkPipelineBindPoint>(&dep,&local_c0,pVVar4[uVar7].pipelineBindPoint,alloc);
      if (pVVar4[uVar7].pPreserveAttachments != (uint32_t *)0x0) {
        preserves.data_.n = (Number)0x0;
        preserves.data_.s.str = (Ch *)0x4000000000000;
        if (pVVar4[uVar7].preserveAttachmentCount != 0) {
          uVar8 = 0;
          do {
            local_1c8._4_1_ = '\0';
            local_1c8._5_1_ = '\0';
            local_1c8._6_1_ = '\0';
            local_1c8._7_1_ = '\0';
            local_1c8._0_4_ = pVVar4[uVar7].pPreserveAttachments[uVar8];
            local_1c8.s.str =
                 (Ch *)((ulong)(-1 < (int)pVVar4[uVar7].pPreserveAttachments[uVar8]) << 0x35 |
                       0x1d6000000000000);
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::PushBack(&preserves,
                       (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        *)&local_1c8.s,alloc);
            uVar8 = uVar8 + 1;
          } while (uVar8 < pVVar4[uVar7].preserveAttachmentCount);
        }
        local_1c8.s.str = (Ch *)0x40500000014ee58;
        local_1c8.n.i64 = (Number)0x13;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&dep,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          *)&local_1c8.s,&preserves,alloc);
      }
      if (pVVar4[uVar7].pInputAttachments != (VkAttachmentReference *)0x0) {
        inputs.data_.n = (Number)0x0;
        inputs.data_.s.str = (Ch *)0x4000000000000;
        if (pVVar4[uVar7].inputAttachmentCount != 0) {
          uVar8 = 0;
          do {
            input.data_.n = (Number)0x0;
            input.data_.s.str = (Ch *)0x3000000000000;
            pVVar5 = pVVar4[uVar7].pInputAttachments;
            uVar1 = pVVar5[uVar8].attachment;
            local_1c8._4_1_ = '\0';
            local_1c8._5_1_ = '\0';
            local_1c8._6_1_ = '\0';
            local_1c8._7_1_ = '\0';
            local_1c8._0_4_ = uVar1;
            preserves.data_.s.str = (Ch *)0x40500000014f88a;
            preserves.data_.n = (Number)0xa;
            local_1c8.s.str = (Ch *)((ulong)(-1 < (int)uVar1) << 0x35 | 0x1d6000000000000);
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember(&input,&preserves,
                        (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)&local_1c8.s,alloc);
            local_d0.s = "layout";
            local_d0.length = 6;
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember<VkImageLayout>(&input,&local_d0,pVVar5[uVar8].layout,alloc);
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::PushBack(&inputs,&input,alloc);
            uVar8 = uVar8 + 1;
          } while (uVar8 < pVVar4[uVar7].inputAttachmentCount);
        }
        local_1c8.s.str = (Ch *)0x40500000014ee36;
        local_1c8.n.i64 = (Number)0x10;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&dep,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          *)&local_1c8.s,&inputs,alloc);
      }
      if (pVVar4[uVar7].pColorAttachments != (VkAttachmentReference *)0x0) {
        inputs.data_.n = (Number)0x0;
        inputs.data_.s.str = (Ch *)0x4000000000000;
        if (pVVar4[uVar7].colorAttachmentCount != 0) {
          uVar8 = 0;
          do {
            input.data_.n = (Number)0x0;
            input.data_.s.str = (Ch *)0x3000000000000;
            pVVar5 = pVVar4[uVar7].pColorAttachments;
            uVar1 = pVVar5[uVar8].attachment;
            local_1c8._4_1_ = '\0';
            local_1c8._5_1_ = '\0';
            local_1c8._6_1_ = '\0';
            local_1c8._7_1_ = '\0';
            local_1c8._0_4_ = uVar1;
            preserves.data_.s.str = (Ch *)0x40500000014f88a;
            preserves.data_.n = (Number)0xa;
            local_1c8.s.str = (Ch *)((ulong)(-1 < (int)uVar1) << 0x35 | 0x1d6000000000000);
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember(&input,&preserves,
                        (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)&local_1c8.s,alloc);
            local_e0.s = "layout";
            local_e0.length = 6;
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember<VkImageLayout>(&input,&local_e0,pVVar5[uVar8].layout,alloc);
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::PushBack(&inputs,&input,alloc);
            uVar8 = uVar8 + 1;
          } while (uVar8 < pVVar4[uVar7].colorAttachmentCount);
        }
        local_1c8.s.str = (Ch *)0x40500000014ee47;
        local_1c8.n.i64 = (Number)0x10;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&dep,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          *)&local_1c8.s,&inputs,alloc);
      }
      if (pVVar4[uVar7].pResolveAttachments != (VkAttachmentReference *)0x0) {
        inputs.data_.n = (Number)0x0;
        inputs.data_.s.str = (Ch *)0x4000000000000;
        if (pVVar4[uVar7].colorAttachmentCount != 0) {
          uVar8 = 0;
          do {
            input.data_.n = (Number)0x0;
            input.data_.s.str = (Ch *)0x3000000000000;
            pVVar5 = pVVar4[uVar7].pResolveAttachments;
            uVar1 = pVVar5[uVar8].attachment;
            local_1c8._4_1_ = '\0';
            local_1c8._5_1_ = '\0';
            local_1c8._6_1_ = '\0';
            local_1c8._7_1_ = '\0';
            local_1c8._0_4_ = uVar1;
            preserves.data_.s.str = (Ch *)0x40500000014f88a;
            preserves.data_.n = (Number)0xa;
            local_1c8.s.str = (Ch *)((ulong)(-1 < (int)uVar1) << 0x35 | 0x1d6000000000000);
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember(&input,&preserves,
                        (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)&local_1c8.s,alloc);
            local_f0.s = "layout";
            local_f0.length = 6;
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember<VkImageLayout>(&input,&local_f0,pVVar5[uVar8].layout,alloc);
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::PushBack(&inputs,&input,alloc);
            uVar8 = uVar8 + 1;
          } while (uVar8 < pVVar4[uVar7].colorAttachmentCount);
        }
        local_1c8.s.str = (Ch *)0x40500000014ee23;
        local_1c8.n.i64 = (Number)0x12;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&dep,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          *)&local_1c8.s,&inputs,alloc);
      }
      if (pVVar4[uVar7].pDepthStencilAttachment != (VkAttachmentReference *)0x0) {
        inputs.data_.n = (Number)0x0;
        inputs.data_.s.str = (Ch *)0x3000000000000;
        uVar1 = (pVVar4[uVar7].pDepthStencilAttachment)->attachment;
        local_1c8._4_1_ = '\0';
        local_1c8._5_1_ = '\0';
        local_1c8._6_1_ = '\0';
        local_1c8._7_1_ = '\0';
        local_1c8._0_4_ = uVar1;
        preserves.data_.s.str = (Ch *)0x40500000014f88a;
        preserves.data_.n = (Number)0xa;
        local_1c8.s.str = (Ch *)((ulong)(-1 < (int)uVar1) << 0x35 | 0x1d6000000000000);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&inputs,&preserves,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_1c8.s,alloc);
        local_100.s = "layout";
        local_100.length = 6;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkImageLayout>
                  (&inputs,&local_100,(pVVar4[uVar7].pDepthStencilAttachment)->layout,alloc);
        local_1c8.s.str = (Ch *)0x40500000014ee0c;
        local_1c8.n.i64 = (Number)0x16;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&dep,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          *)&local_1c8.s,&inputs,alloc);
      }
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::PushBack(&subpasses,&dep,alloc);
      uVar7 = uVar7 + 1;
    } while (uVar7 < pass->subpassCount);
  }
  local_1c8.s.str = (Ch *)0x40500000014eea2;
  local_1c8.n = (Number)0x9;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_158.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_1c8.s,&subpasses,alloc);
  if (pass->pNext != (void *)0x0) {
    preserves.data_.n = (Number)0x0;
    preserves.data_.s.str = (Ch *)0x0;
    bVar6 = pnext_chain_json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                      (pass->pNext,alloc,&preserves,(DynamicStateInfo *)0x0);
    if (!bVar6) {
      return false;
    }
    local_1c8.s.str = (Ch *)0x40500000014ecb5;
    local_1c8.n = (Number)0x5;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_158.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_1c8.s,&preserves,alloc);
  }
  if (&local_158 != &out_value->data_) {
    (out_value->data_).n = local_158.n;
    (out_value->data_).s.str = local_158.s.str;
  }
  return true;
}

Assistant:

static bool json_value(const VkRenderPassCreateInfo& pass, Allocator& alloc, Value *out_value)
{
	Value json_object(kObjectType);
	json_object.AddMember("flags", pass.flags, alloc);

	Value deps(kArrayType);
	Value subpasses(kArrayType);
	Value attachments(kArrayType);

	if (pass.pDependencies)
	{
		for (uint32_t i = 0; i < pass.dependencyCount; i++)
		{
			auto &d = pass.pDependencies[i];
			Value dep(kObjectType);
			dep.AddMember("dependencyFlags", d.dependencyFlags, alloc);
			dep.AddMember("dstAccessMask", d.dstAccessMask, alloc);
			dep.AddMember("srcAccessMask", d.srcAccessMask, alloc);
			dep.AddMember("dstStageMask", d.dstStageMask, alloc);
			dep.AddMember("srcStageMask", d.srcStageMask, alloc);
			dep.AddMember("dstSubpass", d.dstSubpass, alloc);
			dep.AddMember("srcSubpass", d.srcSubpass, alloc);
			deps.PushBack(dep, alloc);
		}
		json_object.AddMember("dependencies", deps, alloc);
	}

	if (pass.pAttachments)
	{
		for (uint32_t i = 0; i < pass.attachmentCount; i++)
		{
			auto &a = pass.pAttachments[i];
			Value att(kObjectType);

			att.AddMember("flags", a.flags, alloc);
			att.AddMember("format", a.format, alloc);
			att.AddMember("finalLayout", a.finalLayout, alloc);
			att.AddMember("initialLayout", a.initialLayout, alloc);
			att.AddMember("loadOp", a.loadOp, alloc);
			att.AddMember("storeOp", a.storeOp, alloc);
			att.AddMember("samples", a.samples, alloc);
			att.AddMember("stencilLoadOp", a.stencilLoadOp, alloc);
			att.AddMember("stencilStoreOp", a.stencilStoreOp, alloc);

			attachments.PushBack(att, alloc);
		}
		json_object.AddMember("attachments", attachments, alloc);
	}

	for (uint32_t i = 0; i < pass.subpassCount; i++)
	{
		auto &sub = pass.pSubpasses[i];
		Value p(kObjectType);
		p.AddMember("flags", sub.flags, alloc);
		p.AddMember("pipelineBindPoint", sub.pipelineBindPoint, alloc);

		if (sub.pPreserveAttachments)
		{
			Value preserves(kArrayType);
			for (uint32_t j = 0; j < sub.preserveAttachmentCount; j++)
				preserves.PushBack(sub.pPreserveAttachments[j], alloc);
			p.AddMember("preserveAttachments", preserves, alloc);
		}

		if (sub.pInputAttachments)
		{
			Value inputs(kArrayType);
			for (uint32_t j = 0; j < sub.inputAttachmentCount; j++)
			{
				Value input(kObjectType);
				auto &ia = sub.pInputAttachments[j];
				input.AddMember("attachment", ia.attachment, alloc);
				input.AddMember("layout", ia.layout, alloc);
				inputs.PushBack(input, alloc);
			}
			p.AddMember("inputAttachments", inputs, alloc);
		}

		if (sub.pColorAttachments)
		{
			Value colors(kArrayType);
			for (uint32_t j = 0; j < sub.colorAttachmentCount; j++)
			{
				Value color(kObjectType);
				auto &c = sub.pColorAttachments[j];
				color.AddMember("attachment", c.attachment, alloc);
				color.AddMember("layout", c.layout, alloc);
				colors.PushBack(color, alloc);
			}
			p.AddMember("colorAttachments", colors, alloc);
		}

		if (sub.pResolveAttachments)
		{
			Value resolves(kArrayType);
			for (uint32_t j = 0; j < sub.colorAttachmentCount; j++)
			{
				Value resolve(kObjectType);
				auto &r = sub.pResolveAttachments[j];
				resolve.AddMember("attachment", r.attachment, alloc);
				resolve.AddMember("layout", r.layout, alloc);
				resolves.PushBack(resolve, alloc);
			}
			p.AddMember("resolveAttachments", resolves, alloc);
		}

		if (sub.pDepthStencilAttachment)
		{
			Value depth_stencil(kObjectType);
			depth_stencil.AddMember("attachment", sub.pDepthStencilAttachment->attachment, alloc);
			depth_stencil.AddMember("layout", sub.pDepthStencilAttachment->layout, alloc);
			p.AddMember("depthStencilAttachment", depth_stencil, alloc);
		}

		subpasses.PushBack(p, alloc);
	}
	json_object.AddMember("subpasses", subpasses, alloc);

	if (!pnext_chain_add_json_value(json_object, pass, alloc, nullptr))
		return false;

	*out_value = json_object;
	return true;
}